

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_part.c
# Opt level: O1

REF_STATUS
ref_part_meshb_geom_delete_me
          (REF_GEOM ref_geom,REF_INT ngeom,REF_INT type,REF_NODE ref_node,REF_INT nnode,FILE *file)

{
  int *piVar1;
  int iVar2;
  REF_MPI ref_mpi;
  FILE *__stream;
  uint uVar3;
  int iVar4;
  uint uVar5;
  void *pvVar6;
  void *pvVar7;
  int *__ptr;
  void *__ptr_00;
  undefined8 *puVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  undefined8 uVar13;
  uint uVar14;
  ulong uVar15;
  long lVar16;
  int iVar17;
  undefined4 in_register_00000084;
  char *pcVar18;
  REF_STATUS RVar19;
  size_t __size;
  REF_DBL *param;
  REF_INT dest;
  size_t sVar20;
  REF_INT node;
  double double_gref;
  REF_INT new_geom;
  REF_INT end_of_message;
  REF_DBL *local_108;
  REF_INT local_f4;
  int local_f0;
  undefined4 uStack_ec;
  uint local_e4;
  void *local_e0;
  void *local_d8;
  void *local_d0;
  int local_c4;
  void *local_c0;
  REF_DBL *local_b8;
  void *local_b0;
  REF_GEOM local_a8;
  int *local_a0;
  int local_94;
  void *local_90;
  void *local_88;
  void *local_80;
  void *local_78;
  FILE *local_70;
  int local_64;
  undefined8 local_60;
  REF_NODE local_58;
  ulong local_50;
  ulong local_48;
  ulong local_40;
  undefined4 *local_38;
  
  ref_mpi = ref_node->ref_mpi;
  local_94 = -1;
  uVar3 = ref_mpi->n;
  uVar9 = (ulong)uVar3;
  uVar14 = 1000000;
  if (1000000 < ngeom / (int)uVar3) {
    uVar14 = ngeom / (int)uVar3;
  }
  uVar15 = (ulong)uVar14;
  if (ngeom <= (int)uVar14) {
    uVar15 = (ulong)(uint)ngeom;
  }
  uVar14 = (uint)uVar15;
  local_a8 = ref_geom;
  local_58 = ref_node;
  if (ngeom < 0) {
    pcVar18 = "malloc sent_node of REF_INT negative";
    uVar13 = 0xbc;
LAB_00189f89:
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar13,
           "ref_part_meshb_geom_delete_me",pcVar18);
    RVar19 = 1;
  }
  else {
    sVar20 = uVar15 << 2;
    local_70 = (FILE *)file;
    local_60 = CONCAT44(in_register_00000084,nnode);
    pvVar6 = malloc(sVar20);
    if (pvVar6 == (void *)0x0) {
      pcVar18 = "malloc sent_node of REF_INT NULL";
      uVar13 = 0xbc;
    }
    else {
      pvVar7 = malloc(sVar20);
      if (pvVar7 == (void *)0x0) {
        pcVar18 = "malloc sent_id of REF_INT NULL";
        uVar13 = 0xbd;
      }
      else {
        local_e0 = pvVar7;
        pvVar7 = malloc(sVar20);
        if (pvVar7 == (void *)0x0) {
          pcVar18 = "malloc sent_gref of REF_INT NULL";
          uVar13 = 0xbe;
        }
        else {
          __size = (ulong)(uVar14 * 2) << 3;
          local_d0 = pvVar6;
          local_b0 = pvVar7;
          local_b8 = (REF_DBL *)malloc(__size);
          if (local_b8 == (REF_DBL *)0x0) {
            pcVar18 = "malloc sent_param of REF_DBL NULL";
            uVar13 = 0xbf;
          }
          else {
            if (ref_mpi->id != 0) {
              do {
                uVar3 = ref_mpi_scatter_recv(ref_mpi,&local_f0,1,1);
                if (uVar3 != 0) {
                  printf("%s: %d: %s: %d %s\n",
                         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                         ,0x129,"ref_part_meshb_geom_delete_me",(ulong)uVar3,"recv");
                  uVar9 = (ulong)uVar3;
                }
                if (uVar3 != 0) {
                  return (REF_STATUS)uVar9;
                }
                if (0 < local_f0) {
                  uVar3 = ref_mpi_scatter_recv(ref_mpi,local_d0,local_f0,1);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x12d,"ref_part_meshb_geom_delete_me",(ulong)uVar3,"send");
                    uVar9 = (ulong)uVar3;
                  }
                  param = local_b8;
                  if (uVar3 != 0) {
                    return (REF_STATUS)uVar9;
                  }
                  uVar3 = ref_mpi_scatter_recv(ref_mpi,local_e0,local_f0,1);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x130,"ref_part_meshb_geom_delete_me",(ulong)uVar3,"send");
                    uVar9 = (ulong)uVar3;
                  }
                  if (uVar3 != 0) {
                    return (REF_STATUS)uVar9;
                  }
                  uVar3 = ref_mpi_scatter_recv(ref_mpi,local_b0,local_f0,1);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x133,"ref_part_meshb_geom_delete_me",(ulong)uVar3,"send");
                    uVar9 = (ulong)uVar3;
                  }
                  if (uVar3 != 0) {
                    return (REF_STATUS)uVar9;
                  }
                  uVar3 = ref_mpi_scatter_recv(ref_mpi,param,local_f0 * 2,3);
                  if (uVar3 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                           ,0x136,"ref_part_meshb_geom_delete_me",(ulong)uVar3,"send");
                    uVar9 = (ulong)uVar3;
                  }
                  if (uVar3 != 0) {
                    return (REF_STATUS)uVar9;
                  }
                  if (0 < local_f0) {
                    lVar16 = 0;
                    do {
                      uVar3 = ref_node_local(local_58,(long)*(int *)((long)local_d0 + lVar16 * 4),
                                             &local_f4);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x138,"ref_part_meshb_geom_delete_me",(ulong)uVar3,"g2l");
                        uVar9 = (ulong)uVar3;
                      }
                      if (uVar3 != 0) {
                        return (REF_STATUS)uVar9;
                      }
                      uVar3 = ref_geom_add(local_a8,local_f4,type,
                                           *(REF_INT *)((long)local_e0 + lVar16 * 4),param);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x13b,"ref_part_meshb_geom_delete_me",(ulong)uVar3,"add geom");
                        uVar9 = (ulong)uVar3;
                      }
                      if (uVar3 != 0) {
                        return (REF_STATUS)uVar9;
                      }
                      uVar3 = ref_geom_find(local_a8,local_f4,type,
                                            *(REF_INT *)((long)local_e0 + lVar16 * 4),&local_c4);
                      if (uVar3 != 0) {
                        printf("%s: %d: %s: %d %s\n",
                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                               ,0x13d,"ref_part_meshb_geom_delete_me",(ulong)uVar3,"find");
                        uVar9 = (ulong)uVar3;
                      }
                      if (uVar3 != 0) {
                        return (REF_STATUS)uVar9;
                      }
                      local_a8->descr[(long)local_c4 * 6 + 2] =
                           *(REF_INT *)((long)local_b0 + lVar16 * 4);
                      lVar16 = lVar16 + 1;
                      param = param + 2;
                    } while (lVar16 < local_f0);
                  }
                }
              } while (local_f0 != local_94);
LAB_00189f38:
              free(local_b8);
              free(local_b0);
              free(local_e0);
              free(local_d0);
              return 0;
            }
            if ((int)uVar3 < 0) {
              pcVar18 = "malloc geom_to_send of REF_INT negative";
              uVar13 = 0xc2;
              goto LAB_00189f89;
            }
            __ptr = (int *)malloc(uVar9 << 2);
            if (__ptr == (int *)0x0) {
              pcVar18 = "malloc geom_to_send of REF_INT NULL";
              uVar13 = 0xc2;
            }
            else {
              local_a0 = (int *)malloc(uVar9 << 2);
              if (local_a0 == (int *)0x0) {
                pcVar18 = "malloc start_to_send of REF_INT NULL";
                uVar13 = 0xc3;
              }
              else {
                pvVar6 = malloc(sVar20);
                if (pvVar6 == (void *)0x0) {
                  pcVar18 = "malloc read_node of REF_INT NULL";
                  uVar13 = 0xc4;
                }
                else {
                  local_d8 = pvVar6;
                  pvVar6 = malloc(sVar20);
                  if (pvVar6 == (void *)0x0) {
                    pcVar18 = "malloc read_id of REF_INT NULL";
                    uVar13 = 0xc5;
                  }
                  else {
                    pvVar7 = malloc(sVar20);
                    if (pvVar7 == (void *)0x0) {
                      pcVar18 = "malloc read_gref of REF_INT NULL";
                      uVar13 = 0xc6;
                    }
                    else {
                      local_88 = pvVar7;
                      pvVar7 = malloc(__size);
                      if (pvVar7 == (void *)0x0) {
                        pcVar18 = "malloc read_param of REF_DBL NULL";
                        uVar13 = 199;
                      }
                      else {
                        __ptr_00 = malloc(sVar20);
                        if (__ptr_00 != (void *)0x0) {
                          local_80 = pvVar6;
                          if (ngeom != 0) {
                            local_50 = (ulong)((int)local_60 - 1);
                            local_40 = (ulong)(uint)type;
                            iVar17 = 0;
                            local_90 = __ptr_00;
                            local_78 = pvVar7;
                            do {
                              local_e4 = ngeom - iVar17;
                              uVar3 = local_e4;
                              if ((int)uVar14 < (int)local_e4) {
                                uVar3 = uVar14;
                              }
                              local_64 = iVar17;
                              if (0 < (int)local_e4) {
                                local_48 = 1;
                                if (1 < (int)uVar3) {
                                  local_48 = (ulong)uVar3;
                                }
                                uVar9 = 0;
                                local_c0 = local_78;
                                do {
                                  __stream = local_70;
                                  sVar20 = fread((void *)((long)local_d8 + uVar9 * 4),4,1,local_70);
                                  if (sVar20 != 1) {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0xce,"ref_part_meshb_geom_delete_me","n",1,sVar20);
                                    pvVar6 = (void *)0x1;
                                  }
                                  if (sVar20 != 1) {
                                    return (REF_STATUS)pvVar6;
                                  }
                                  local_38 = (undefined4 *)((long)local_80 + uVar9 * 4);
                                  sVar20 = fread(local_38,4,1,__stream);
                                  if (sVar20 != 1) {
                                    printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0xcf,"ref_part_meshb_geom_delete_me","n",1,sVar20);
                                    pvVar6 = (void *)0x1;
                                  }
                                  if (sVar20 != 1) {
                                    return (REF_STATUS)pvVar6;
                                  }
                                  puVar8 = (undefined8 *)(uVar9 * 0x10 + (long)local_78);
                                  *puVar8 = 0;
                                  puVar8[1] = 0;
                                  pvVar7 = local_c0;
                                  uVar15 = local_40;
                                  if (0 < type) {
                                    do {
                                      sVar20 = fread(pvVar7,8,1,local_70);
                                      if (sVar20 != 1) {
                                        printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                               ,0xd4,"ref_part_meshb_geom_delete_me","param",1,
                                               sVar20);
                                        pvVar6 = (void *)0x1;
                                      }
                                      if (sVar20 != 1) {
                                        return (REF_STATUS)pvVar6;
                                      }
                                      pvVar7 = (void *)((long)pvVar7 + 8);
                                      uVar15 = uVar15 - 1;
                                    } while (uVar15 != 0);
                                  }
                                  *(undefined4 *)((long)local_88 + uVar9 * 4) = *local_38;
                                  if (0 < type) {
                                    sVar20 = fread(&local_f0,8,1,local_70);
                                    if (sVar20 != 1) {
                                      printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0xd7,"ref_part_meshb_geom_delete_me","gref",1,sVar20);
                                      pvVar6 = (void *)0x1;
                                    }
                                    if (sVar20 != 1) {
                                      return (REF_STATUS)pvVar6;
                                    }
                                    *(int *)((long)local_88 + uVar9 * 4) =
                                         (int)(double)CONCAT44(uStack_ec,local_f0);
                                  }
                                  uVar9 = uVar9 + 1;
                                  local_c0 = (void *)((long)local_c0 + 0x10);
                                } while (uVar9 != local_48);
                              }
                              if (0 < (int)local_e4) {
                                uVar9 = 1;
                                if (1 < (int)uVar3) {
                                  uVar9 = (ulong)uVar3;
                                }
                                uVar15 = 0;
                                do {
                                  piVar1 = (int *)((long)local_d8 + uVar15 * 4);
                                  *piVar1 = *piVar1 + -1;
                                  uVar15 = uVar15 + 1;
                                } while (uVar9 != uVar15);
                              }
                              if (0 < (int)local_e4) {
                                iVar17 = ref_mpi->n;
                                iVar10 = ((int)local_50 + iVar17) / iVar17;
                                iVar11 = (int)((long)((ulong)(uint)((int)local_50 >> 0x1f) << 0x20 |
                                                     local_50 & 0xffffffff) / (long)iVar17);
                                iVar17 = (int)local_60 - iVar11 * iVar17;
                                uVar9 = 1;
                                if (1 < (int)uVar3) {
                                  uVar9 = (ulong)uVar3;
                                }
                                uVar15 = 0;
                                do {
                                  iVar2 = *(int *)((long)local_d8 + uVar15 * 4);
                                  iVar4 = iVar2 / iVar10;
                                  if (iVar17 <= iVar4) {
                                    iVar4 = (iVar2 - iVar10 * iVar17) / iVar11 + iVar17;
                                  }
                                  *(int *)((long)local_90 + uVar15 * 4) = iVar4;
                                  uVar15 = uVar15 + 1;
                                } while (uVar9 != uVar15);
                              }
                              if (0 < ref_mpi->n) {
                                lVar16 = 0;
                                do {
                                  __ptr[lVar16] = 0;
                                  lVar16 = lVar16 + 1;
                                } while (lVar16 < ref_mpi->n);
                              }
                              if (0 < (int)local_e4) {
                                uVar9 = 1;
                                if (1 < (int)uVar3) {
                                  uVar9 = (ulong)uVar3;
                                }
                                uVar15 = 0;
                                do {
                                  __ptr[*(int *)((long)local_90 + uVar15 * 4)] =
                                       __ptr[*(int *)((long)local_90 + uVar15 * 4)] + 1;
                                  uVar15 = uVar15 + 1;
                                } while (uVar9 != uVar15);
                              }
                              *local_a0 = 0;
                              iVar17 = ref_mpi->n;
                              if (1 < (long)iVar17) {
                                iVar11 = *local_a0;
                                lVar16 = 0;
                                do {
                                  iVar11 = iVar11 + __ptr[lVar16];
                                  local_a0[lVar16 + 1] = iVar11;
                                  lVar16 = lVar16 + 1;
                                } while ((long)iVar17 + -1 != lVar16);
                              }
                              if (0 < ref_mpi->n) {
                                lVar16 = 0;
                                do {
                                  __ptr[lVar16] = 0;
                                  lVar16 = lVar16 + 1;
                                } while (lVar16 < ref_mpi->n);
                              }
                              if (0 < (int)local_e4) {
                                uVar9 = 1;
                                if (1 < (int)uVar3) {
                                  uVar9 = (ulong)uVar3;
                                }
                                lVar16 = 0;
                                do {
                                  iVar17 = *(int *)((long)local_90 + lVar16);
                                  iVar11 = __ptr[iVar17];
                                  __ptr[iVar17] = iVar11 + 1;
                                  lVar12 = (long)local_a0[iVar17] + (long)iVar11;
                                  *(undefined4 *)((long)local_d0 + lVar12 * 4) =
                                       *(undefined4 *)((long)local_d8 + lVar16);
                                  *(undefined4 *)((long)local_e0 + lVar12 * 4) =
                                       *(undefined4 *)((long)local_80 + lVar16);
                                  *(undefined4 *)((long)local_b0 + lVar12 * 4) =
                                       *(undefined4 *)((long)local_88 + lVar16);
                                  local_b8[(int)lVar12 * 2] =
                                       *(REF_DBL *)((long)local_78 + lVar16 * 4);
                                  local_b8[(int)lVar12 * 2 + 1] =
                                       *(REF_DBL *)((long)local_78 + lVar16 * 4 + 8);
                                  lVar16 = lVar16 + 4;
                                } while (uVar9 << 2 != lVar16);
                              }
                              local_c0 = (void *)(long)*__ptr;
                              if (0 < (long)local_c0) {
                                local_108 = local_b8;
                                lVar16 = 0;
                                do {
                                  uVar5 = ref_node_local(local_58,(long)*(int *)((long)local_d0 +
                                                                                lVar16 * 4),
                                                         &local_f4);
                                  if (uVar5 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0xf9,"ref_part_meshb_geom_delete_me",(ulong)uVar5,"g2l")
                                    ;
                                    pvVar6 = (void *)(ulong)uVar5;
                                  }
                                  if (uVar5 != 0) {
                                    return (REF_STATUS)pvVar6;
                                  }
                                  uVar5 = ref_geom_add(local_a8,local_f4,type,
                                                       *(REF_INT *)((long)local_e0 + lVar16 * 4),
                                                       local_108);
                                  if (uVar5 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0xfc,"ref_part_meshb_geom_delete_me",(ulong)uVar5,
                                           "add geom");
                                    pvVar6 = (void *)(ulong)uVar5;
                                  }
                                  if (uVar5 != 0) {
                                    return (REF_STATUS)pvVar6;
                                  }
                                  uVar5 = ref_geom_find(local_a8,local_f4,type,
                                                        *(REF_INT *)((long)local_e0 + lVar16 * 4),
                                                        &local_c4);
                                  if (uVar5 != 0) {
                                    printf("%s: %d: %s: %d %s\n",
                                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                           ,0xfe,"ref_part_meshb_geom_delete_me",(ulong)uVar5,"find"
                                          );
                                    pvVar6 = (void *)(ulong)uVar5;
                                  }
                                  if (uVar5 != 0) {
                                    return (REF_STATUS)pvVar6;
                                  }
                                  local_a8->descr[(long)local_c4 * 6 + 2] =
                                       *(REF_INT *)((long)local_b0 + lVar16 * 4);
                                  lVar16 = lVar16 + 1;
                                  local_108 = local_108 + 2;
                                } while (local_c0 != (void *)lVar16);
                              }
                              if (1 < ref_mpi->n) {
                                lVar16 = 1;
                                pvVar7 = (void *)0x4;
                                do {
                                  if (0 < __ptr[lVar16]) {
                                    dest = (REF_INT)lVar16;
                                    local_c0 = pvVar7;
                                    uVar5 = ref_mpi_scatter_send
                                                      (ref_mpi,(void *)((long)__ptr + (long)pvVar7),
                                                       1,1,dest);
                                    if (uVar5 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x107,"ref_part_meshb_geom_delete_me",(ulong)uVar5,
                                             "send");
                                      pvVar6 = (void *)(ulong)uVar5;
                                    }
                                    if (uVar5 != 0) {
                                      return (REF_STATUS)pvVar6;
                                    }
                                    iVar17 = local_a0[lVar16];
                                    lVar12 = (long)iVar17;
                                    uVar5 = ref_mpi_scatter_send
                                                      (ref_mpi,(void *)((long)local_d0 + lVar12 * 4)
                                                       ,__ptr[lVar16],1,dest);
                                    if (uVar5 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x10a,"ref_part_meshb_geom_delete_me",(ulong)uVar5,
                                             "send");
                                      pvVar6 = (void *)(ulong)uVar5;
                                    }
                                    if (uVar5 != 0) {
                                      return (REF_STATUS)pvVar6;
                                    }
                                    uVar5 = ref_mpi_scatter_send
                                                      (ref_mpi,(void *)((long)local_e0 + lVar12 * 4)
                                                       ,__ptr[lVar16],1,dest);
                                    if (uVar5 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x10d,"ref_part_meshb_geom_delete_me",(ulong)uVar5,
                                             "send");
                                      pvVar6 = (void *)(ulong)uVar5;
                                    }
                                    if (uVar5 != 0) {
                                      return (REF_STATUS)pvVar6;
                                    }
                                    uVar5 = ref_mpi_scatter_send
                                                      (ref_mpi,(void *)((long)local_b0 + lVar12 * 4)
                                                       ,__ptr[lVar16],1,dest);
                                    if (uVar5 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x110,"ref_part_meshb_geom_delete_me",(ulong)uVar5,
                                             "send");
                                      pvVar6 = (void *)(ulong)uVar5;
                                    }
                                    if (uVar5 != 0) {
                                      return (REF_STATUS)pvVar6;
                                    }
                                    uVar5 = ref_mpi_scatter_send
                                                      (ref_mpi,local_b8 + iVar17 * 2,
                                                       __ptr[lVar16] * 2,3,dest);
                                    if (uVar5 != 0) {
                                      printf("%s: %d: %s: %d %s\n",
                                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                             ,0x114,"ref_part_meshb_geom_delete_me",(ulong)uVar5,
                                             "send");
                                      pvVar6 = (void *)(ulong)uVar5;
                                    }
                                    pvVar7 = local_c0;
                                    if (uVar5 != 0) {
                                      return (REF_STATUS)pvVar6;
                                    }
                                  }
                                  lVar16 = lVar16 + 1;
                                  pvVar7 = (void *)((long)pvVar7 + 4);
                                } while (lVar16 < ref_mpi->n);
                              }
                              iVar17 = local_64 + uVar3;
                              pvVar7 = local_78;
                              __ptr_00 = local_90;
                            } while (iVar17 < ngeom);
                          }
                          piVar1 = local_a0;
                          free(__ptr_00);
                          free(pvVar7);
                          free(local_88);
                          free(local_80);
                          free(local_d8);
                          free(piVar1);
                          free(__ptr);
                          if (1 < ref_mpi->n) {
                            iVar17 = 1;
                            do {
                              uVar3 = ref_mpi_scatter_send(ref_mpi,&local_94,1,1,iVar17);
                              if (uVar3 != 0) {
                                printf("%s: %d: %s: %d %s\n",
                                       "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c"
                                       ,0x124,"ref_part_meshb_geom_delete_me",(ulong)uVar3,"send");
                                pvVar6 = (void *)(ulong)uVar3;
                              }
                              if (uVar3 != 0) {
                                return (REF_STATUS)pvVar6;
                              }
                              iVar17 = iVar17 + 1;
                            } while (iVar17 < ref_mpi->n);
                          }
                          goto LAB_00189f38;
                        }
                        pcVar18 = "malloc dest of REF_INT NULL";
                        uVar13 = 200;
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_part.c",uVar13,
           "ref_part_meshb_geom_delete_me",pcVar18);
    RVar19 = 2;
  }
  return RVar19;
}

Assistant:

REF_FCN REF_STATUS ref_part_meshb_geom_delete_me(REF_GEOM ref_geom,
                                                 REF_INT ngeom, REF_INT type,
                                                 REF_NODE ref_node,
                                                 REF_INT nnode, FILE *file) {
  REF_MPI ref_mpi = ref_node_mpi(ref_node);
  REF_INT end_of_message = REF_EMPTY;
  REF_INT chunk;
  REF_INT *sent_node;
  REF_INT *sent_id;
  REF_INT *sent_gref;
  REF_DBL *sent_param;
  REF_INT *read_node;
  REF_INT *read_id;
  REF_INT *read_gref;
  REF_DBL *read_param;
  double double_gref;

  REF_INT ngeom_read, ngeom_keep;
  REF_INT section_size;

  REF_INT *dest;
  REF_INT *geom_to_send;
  REF_INT *start_to_send;

  REF_INT geom_to_receive;

  REF_INT geom, i, new_geom;
  REF_INT part, node;
  REF_INT new_location;

  chunk = MAX(1000000, ngeom / ref_mpi_n(ref_mpi));
  chunk = MIN(chunk, ngeom);

  ref_malloc(sent_node, chunk, REF_INT);
  ref_malloc(sent_id, chunk, REF_INT);
  ref_malloc(sent_gref, chunk, REF_INT);
  ref_malloc(sent_param, 2 * chunk, REF_DBL);

  if (ref_mpi_once(ref_mpi)) {
    ref_malloc(geom_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(start_to_send, ref_mpi_n(ref_mpi), REF_INT);
    ref_malloc(read_node, chunk, REF_INT);
    ref_malloc(read_id, chunk, REF_INT);
    ref_malloc(read_gref, chunk, REF_INT);
    ref_malloc(read_param, 2 * chunk, REF_DBL);
    ref_malloc(dest, chunk, REF_INT);

    ngeom_read = 0;
    while (ngeom_read < ngeom) {
      section_size = MIN(chunk, ngeom - ngeom_read);
      for (geom = 0; geom < section_size; geom++) {
        REIS(1, fread(&(read_node[geom]), sizeof(REF_INT), 1, file), "n");
        REIS(1, fread(&(read_id[geom]), sizeof(REF_INT), 1, file), "n");
        for (i = 0; i < 2; i++)
          read_param[i + 2 * geom] = 0.0; /* ensure init */
        for (i = 0; i < type; i++)
          REIS(1, fread(&(read_param[i + 2 * geom]), sizeof(double), 1, file),
               "param");
        read_gref[geom] = read_id[geom];
        if (0 < type) {
          REIS(1, fread(&(double_gref), sizeof(double), 1, file), "gref");
          read_gref[geom] = (REF_INT)double_gref;
        }
      }
      for (geom = 0; geom < section_size; geom++) read_node[geom]--;

      ngeom_read += section_size;

      for (geom = 0; geom < section_size; geom++)
        dest[geom] =
            ref_part_implicit(nnode, ref_mpi_n(ref_mpi), read_node[geom]);

      each_ref_mpi_part(ref_mpi, part) geom_to_send[part] = 0;
      for (geom = 0; geom < section_size; geom++) geom_to_send[dest[geom]]++;

      start_to_send[0] = 0;
      each_ref_mpi_worker(ref_mpi, part) {
        start_to_send[part] = start_to_send[part - 1] + geom_to_send[part - 1];
      }

      each_ref_mpi_part(ref_mpi, part) geom_to_send[part] = 0;
      for (geom = 0; geom < section_size; geom++) {
        new_location = start_to_send[dest[geom]] + geom_to_send[dest[geom]];
        sent_node[new_location] = read_node[geom];
        sent_id[new_location] = read_id[geom];
        sent_gref[new_location] = read_gref[geom];
        sent_param[0 + 2 * new_location] = read_param[0 + 2 * geom];
        sent_param[1 + 2 * new_location] = read_param[1 + 2 * geom];
        geom_to_send[dest[geom]]++;
      }

      /* rank 0 keepers */
      ngeom_keep = geom_to_send[0];
      for (geom = 0; geom < ngeom_keep; geom++) {
        RSS(ref_node_local(ref_node, sent_node[geom], &node), "g2l");
        RSS(ref_geom_add(ref_geom, node, type, sent_id[geom],
                         &(sent_param[2 * geom])),
            "add geom");
        RSS(ref_geom_find(ref_geom, node, type, sent_id[geom], &new_geom),
            "find");
        ref_geom_gref(ref_geom, new_geom) = sent_gref[geom];
      }

      /* ship it! */
      each_ref_mpi_worker(ref_mpi, part) {
        if (0 < geom_to_send[part]) {
          RSS(ref_mpi_scatter_send(ref_mpi, &(geom_to_send[part]), 1,
                                   REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi, &(sent_node[start_to_send[part]]),
                                   geom_to_send[part], REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi, &(sent_id[start_to_send[part]]),
                                   geom_to_send[part], REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi, &(sent_gref[start_to_send[part]]),
                                   geom_to_send[part], REF_INT_TYPE, part),
              "send");
          RSS(ref_mpi_scatter_send(ref_mpi,
                                   &(sent_param[2 * start_to_send[part]]),
                                   2 * geom_to_send[part], REF_DBL_TYPE, part),
              "send");
        }
      }
    }

    ref_free(dest);
    ref_free(read_param);
    ref_free(read_gref);
    ref_free(read_id);
    ref_free(read_node);
    ref_free(start_to_send);
    ref_free(geom_to_send);

    /* signal we are done */
    each_ref_mpi_worker(ref_mpi, part) {
      RSS(ref_mpi_scatter_send(ref_mpi, &end_of_message, 1, REF_INT_TYPE, part),
          "send");
    }
  } else {
    do {
      RSS(ref_mpi_scatter_recv(ref_mpi, &geom_to_receive, 1, REF_INT_TYPE),
          "recv");
      if (geom_to_receive > 0) {
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_node, geom_to_receive,
                                 REF_INT_TYPE),
            "send");
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_id, geom_to_receive,
                                 REF_INT_TYPE),
            "send");
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_gref, geom_to_receive,
                                 REF_INT_TYPE),
            "send");
        RSS(ref_mpi_scatter_recv(ref_mpi, sent_param, 2 * geom_to_receive,
                                 REF_DBL_TYPE),
            "send");
        for (geom = 0; geom < geom_to_receive; geom++) {
          RSS(ref_node_local(ref_node, sent_node[geom], &node), "g2l");
          RSS(ref_geom_add(ref_geom, node, type, sent_id[geom],
                           &(sent_param[2 * geom])),
              "add geom");
          RSS(ref_geom_find(ref_geom, node, type, sent_id[geom], &new_geom),
              "find");
          ref_geom_gref(ref_geom, new_geom) = sent_gref[geom];
        }
      }
    } while (geom_to_receive != end_of_message);
  }

  free(sent_param);
  free(sent_gref);
  free(sent_id);
  free(sent_node);

  return REF_SUCCESS;
}